

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O3

_Bool coll_tmap_contains_key(coll_tmap_t *map,void *key)

{
  coll_tmap_entry_t *pcVar1;
  int iVar2;
  long lVar3;
  
  pcVar1 = map->root;
  do {
    if (pcVar1 == (coll_tmap_entry_t *)0x0) {
      return false;
    }
    iVar2 = (*map->cmp)(key,pcVar1->key);
    if (iVar2 < 0) {
      lVar3 = 0x10;
    }
    else {
      lVar3 = 0x18;
      if (iVar2 == 0) {
        return true;
      }
    }
    pcVar1 = *(coll_tmap_entry_t **)((long)&pcVar1->key + lVar3);
  } while( true );
}

Assistant:

static entry_t *coll_tmap_entry_of(coll_tmap_t *map, void *key) {
    entry_t *cur = map->root;
    while (cur) {
        int result = map->cmp(key, cur->key);
        if (result < 0) {
            cur = cur->left;
        } else if (result > 0) {
            cur = cur->right;
        } else {
            return cur;
        }
    }
    return NULL;
}